

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::BasicCutter::
grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>
          (BasicCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,int pierced_side)

{
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *in_RSI;
  BasicCutter *in_RDI;
  int in_R8D;
  anon_class_1_0_00000001 on_new_arc_1;
  anon_class_8_1_b4f2a08e should_follow_arc_1;
  anon_class_1_0_00000001 on_new_node_1;
  anon_class_1_0_00000001 on_new_arc;
  anon_class_8_1_7e1b71c4 should_follow_arc;
  anon_class_16_2_93407056 on_new_node;
  int target_hit;
  bool was_flow_augmented;
  anon_class_24_3_815bacf1 increase_flow;
  anon_class_16_2_2a318a2d is_target;
  anon_class_16_2_a16619e3 is_source;
  anon_class_24_3_c9054677 is_backward_saturated;
  anon_class_24_3_4039d62d is_forward_saturated;
  int my_target_side;
  int my_source_side;
  AssimilatedNodeSet *other;
  ReachableNodeSet *in_stack_ffffffffffffff20;
  anon_class_24_3_815bacf1 *in_stack_ffffffffffffff30;
  anon_class_8_1_7e1b71c4 *in_stack_ffffffffffffff38;
  anon_class_16_2_93407056 *in_stack_ffffffffffffff40;
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *graph_00;
  ReachableNodeSet *this_00;
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *graph_01;
  int iVar1;
  uint3 in_stack_ffffffffffffff64;
  uint uVar2;
  ConstRefIDIDFunc<ArrayIDIDFunc> on_new_arc_00;
  undefined1 local_80 [24];
  unsigned_long *local_68;
  anon_class_8_1_b4f2a08e local_60 [2];
  int *local_50;
  undefined1 local_48 [56];
  Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
  *local_10;
  
  local_48._28_4_ = 1 - in_R8D;
  local_48._16_8_ = local_48 + 0x20;
  local_50 = (int *)(local_48 + 0x1c);
  local_68 = (unsigned_long *)(local_48 + 0x20);
  local_80._8_8_ = local_48 + 0x1c;
  uVar2 = (uint)in_stack_ffffffffffffff64;
  on_new_arc_00.ptr = (ArrayIDIDFunc *)in_RDI;
  local_10 = in_RSI;
  do {
    iVar1 = -1;
    this_00 = (ReachableNodeSet *)local_80;
    graph_01 = (Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
                *)&stack0xffffffffffffff60;
    graph_00 = (Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
                *)local_48;
    other = (AssimilatedNodeSet *)&stack0xffffffffffffff47;
    ReachableNodeSet::
    grow<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_6_,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_7_,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_8_>
              ((ReachableNodeSet *)CONCAT44(uVar2,0xffffffff),graph_01,(TemporaryData *)this_00,
               (BreadthFirstSearch *)graph_00,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (anon_class_1_0_00000001 *)on_new_arc_00.ptr);
    if (iVar1 != -1) {
      check_flow_conservation<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
                (in_RDI,local_10);
      ReachableNodeSet::
      forall_arcs_in_path_to<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_3_,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_5_>
                (this_00,graph_00,(anon_class_16_2_a16619e3 *)in_stack_ffffffffffffff40,
                 (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30);
      check_flow_conservation<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
                (in_RDI,local_10);
      ReachableNodeSet::reset(in_stack_ffffffffffffff20,other);
      in_RDI->flow_intensity = in_RDI->flow_intensity + 1;
      if (in_RDI->max_flow_intensity < in_RDI->flow_intensity) {
        return;
      }
      uVar2 = CONCAT13(1,(int3)uVar2);
      check_flow_conservation<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
                (in_RDI,local_10);
    }
  } while (iVar1 != -1);
  if ((uVar2 & 0x1000000) != 0) {
    ReachableNodeSet::reset(in_stack_ffffffffffffff20,other);
    ReachableNodeSet::
    grow<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_9_,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_10_,flow_cutter::BasicCutter::grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::BreadthFirstSearch>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,int)::_lambda(int)_11_>
              ((ReachableNodeSet *)CONCAT44(uVar2,iVar1),graph_01,(TemporaryData *)this_00,
               (BreadthFirstSearch *)graph_00,(anon_class_1_0_00000001 *)in_stack_ffffffffffffff40,
               (anon_class_8_1_b4f2a08e *)(local_80 + 0x20),
               (anon_class_1_0_00000001 *)on_new_arc_00.ptr);
  }
  return;
}

Assistant:

void grow_reachable_sets(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        int pierced_side)
    {

        int my_source_side = pierced_side;
        int my_target_side = 1 - pierced_side;

        assert(reachable[pierced_side].can_grow());

        auto is_forward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, my_source_side, xy);
        };

        auto is_backward_saturated = [&, this](int xy) {
            return this->is_saturated(graph, my_target_side, xy);
        };

        auto is_source = [&](int x) {
            return assimilated[my_source_side].is_inside(x);
        };

        auto is_target = [&](int x) {
            return assimilated[my_target_side].is_inside(x);
        };

        auto increase_flow = [&](int xy) {
            if (pierced_side == source_side)
                flow.increase(graph, xy);
            else
                flow.decrease(graph, xy);
        };

        bool was_flow_augmented = false;

        int target_hit;
        do {
            target_hit = -1;
            auto on_new_node = [&](int x) {
                if (is_target(x)) {
                    target_hit = x;
                    return false;
                } else
                    return true;
            };
            auto should_follow_arc = [&](int xy) {
                return !is_forward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            reachable[my_source_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc);

            if (target_hit != -1) {
                check_flow_conservation(graph);
                reachable[my_source_side].forall_arcs_in_path_to(
                    graph, is_source, target_hit, increase_flow);
                check_flow_conservation(graph);
                reachable[my_source_side].reset(assimilated[my_source_side]);

                ++flow_intensity;
                if(flow_intensity > max_flow_intensity)
                    return;
                was_flow_augmented = true;
                check_flow_conservation(graph);
            }
        } while (target_hit != -1);

        if (was_flow_augmented) {
            reachable[my_target_side].reset(assimilated[my_target_side]);
            auto on_new_node = [&](int x) { return true; };
            auto should_follow_arc = [&](int xy) {
                return !is_backward_saturated(xy);
            };
            auto on_new_arc = [](int xy) {};
            reachable[my_target_side].grow(graph, tmp, search_algo, on_new_node,
                should_follow_arc, on_new_arc);
        }
    }